

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covMinSop.c
# Opt level: O0

Min_Cube_t * Min_SopComplement(Min_Man_t *p,Min_Cube_t *pSharp)

{
  int iVar1;
  uint uVar2;
  Min_Cube_t *pMVar3;
  int local_5c;
  int i;
  int Value;
  int Num;
  Min_Cube_t **ppPrev;
  Min_Cube_t *pThis;
  Min_Cube_t *pReady;
  Min_Cube_t *pNext;
  Min_Cube_t *pCube;
  Min_Cube_t *pCover;
  Vec_Int_t *vVars;
  Min_Cube_t *pSharp_local;
  Min_Man_t *p_local;
  
  vVars = (Vec_Int_t *)pSharp;
  pSharp_local = (Min_Cube_t *)p;
  pCover = (Min_Cube_t *)Vec_IntAlloc(100);
  pCube = Min_CubeAlloc((Min_Man_t *)pSharp_local);
  pNext = (Min_Cube_t *)vVars;
  do {
    if (pNext == (Min_Cube_t *)0x0) {
      Vec_IntFree((Vec_Int_t *)pCover);
      Min_CoverExpandRemoveEqual((Min_Man_t *)pSharp_local,pCube);
      Min_SopDist1Merge((Min_Man_t *)pSharp_local);
      Min_SopContain((Min_Man_t *)pSharp_local);
      pMVar3 = Min_CoverCollect((Min_Man_t *)pSharp_local,*(int *)&pSharp_local->pNext);
      return pMVar3;
    }
    _Value = (Min_Cube_t *)&pCube;
    for (ppPrev = &pCube->pNext; ppPrev != (Min_Cube_t **)0x0; ppPrev = &(*ppPrev)->pNext) {
      iVar1 = Min_CubesDisjoint((Min_Cube_t *)ppPrev,pNext);
      if (iVar1 == 0) {
        pMVar3 = *ppPrev;
        Min_CoverGetDisjVars((Min_Cube_t *)ppPrev,pNext,(Vec_Int_t *)pCover);
        pThis = (Min_Cube_t *)ppPrev;
        local_5c = Vec_IntSize((Vec_Int_t *)pCover);
        while (local_5c = local_5c + -1, -1 < local_5c) {
          Vec_IntEntry((Vec_Int_t *)pCover,local_5c);
          Min_CubeXorVar(pThis,*(int *)(*(long *)&pCover->field_0x8 + (long)local_5c * 4),3);
          if (local_5c == 0) break;
          uVar2 = Min_CubeGetVar(pThis,*(int *)(*(long *)&pCover->field_0x8 + (long)local_5c * 4));
          pThis = Min_CubeDup((Min_Man_t *)pSharp_local,pThis);
          Min_CubeXorVar(pThis,*(int *)(*(long *)&pCover->field_0x8 + (long)local_5c * 4),uVar2 ^ 3)
          ;
          _Value->pNext = pThis;
          _Value = pThis;
        }
        ppPrev = &pThis->pNext;
        pThis->pNext = pMVar3;
      }
      _Value = (Min_Cube_t *)ppPrev;
    }
    pNext = pNext->pNext;
  } while( true );
}

Assistant:

Min_Cube_t * Min_SopComplement( Min_Man_t * p, Min_Cube_t * pSharp )
{
     Vec_Int_t * vVars;
     Min_Cube_t * pCover, * pCube, * pNext, * pReady, * pThis, ** ppPrev;
     int Num, Value, i;

     // get the variables
     vVars = Vec_IntAlloc( 100 );
    // create the tautology cube
     pCover = Min_CubeAlloc( p );
     // sharp it with all cubes
     Min_CoverForEachCube( pSharp, pCube )
     Min_CoverForEachCubePrev( pCover, pThis, ppPrev )
     {
        if ( Min_CubesDisjoint( pThis, pCube ) )
            continue;
        // remember the next pointer
        pNext = pThis->pNext;
        // get the variables, in which pThis is '-' while pCube is fixed
        Min_CoverGetDisjVars( pThis, pCube, vVars );
        // generate the disjoint cubes
        pReady = pThis;
        Vec_IntForEachEntryReverse( vVars, Num, i )
        {
            // correct the literal
            Min_CubeXorVar( pReady, vVars->pArray[i], 3 );
            if ( i == 0 )
                break;
            // create the new cube and clean this value
            Value = Min_CubeGetVar( pReady, vVars->pArray[i] );
            pReady = Min_CubeDup( p, pReady );
            Min_CubeXorVar( pReady, vVars->pArray[i], 3 ^ Value );
            // add to the cover
            *ppPrev = pReady;
            ppPrev = &pReady->pNext;
        }
        pThis = pReady;
        pThis->pNext = pNext;
     }
     Vec_IntFree( vVars );

     // perform dist-1 merge and contain
     Min_CoverExpandRemoveEqual( p, pCover );
     Min_SopDist1Merge( p );
     Min_SopContain( p );
     return Min_CoverCollect( p, p->nVars );
}